

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int libssh2_channel_eof(LIBSSH2_CHANNEL *channel)

{
  uint uVar1;
  uint uVar2;
  list_node *local_28;
  LIBSSH2_PACKET *packet;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local._4_4_ = -0x27;
  }
  else {
    for (local_28 = (list_node *)_libssh2_list_first(&channel->session->packets);
        local_28 != (list_node *)0x0; local_28 = (list_node *)_libssh2_list_next(local_28)) {
      if (((*(char *)&(local_28[1].next)->next == '^') ||
          (*(char *)&(local_28[1].next)->next == '_')) &&
         (uVar1 = (channel->local).id,
         uVar2 = _libssh2_ntohu32((uchar *)((long)&(local_28[1].next)->next + 1)), uVar1 == uVar2))
      {
        return 0;
      }
    }
    channel_local._4_4_ = (int)(channel->remote).eof;
  }
  return channel_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_channel_eof(LIBSSH2_CHANNEL * channel)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while (packet) {
        if (((packet->data[0] == SSH_MSG_CHANNEL_DATA)
             || (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA))
            && (channel->local.id == _libssh2_ntohu32(packet->data + 1))) {
            /* There's data waiting to be read yet, mask the EOF status */
            return 0;
        }
        packet = _libssh2_list_next(&packet->node);
    }

    return channel->remote.eof;
}